

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O2

int XUtf8TextWidth(XUtf8FontStruct *font_set,char *string,int num_bytes)

{
  int *piVar1;
  XFontStruct **ppXVar2;
  unsigned_short uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint ucs_00;
  char glyph [2];
  int local_178;
  uint ucs;
  int local_16c;
  ulong local_168;
  uchar *local_160;
  uint local_158;
  int local_154;
  long local_150;
  long local_148;
  int *local_140;
  XChar2b buf [128];
  
  iVar6 = font_set->nb_font;
  lVar9 = (long)iVar6;
  if (0 < lVar9) {
    local_140 = font_set->ranges;
    piVar1 = font_set->encodings;
    ppXVar2 = font_set->fonts;
    for (local_150 = 0; lVar9 != local_150; local_150 = local_150 + 1) {
      if (ppXVar2[local_150] != (XFontStruct *)0x0) {
        uVar7 = 0;
        local_178 = 0;
        lVar8 = local_150;
        do {
          lVar10 = local_150;
          iVar4 = (int)lVar8;
          lVar8 = (long)iVar4;
          if (num_bytes < 1) {
            iVar6 = XTextWidth16(ppXVar2[lVar8],buf);
            return iVar6 + local_178;
          }
          local_16c = iVar4;
          local_148 = lVar8;
          if (0x78 < (int)uVar7) {
            iVar4 = XTextWidth16(ppXVar2[lVar8],buf);
            local_178 = local_178 + iVar4;
            local_168 = 0;
            uVar7 = local_168;
          }
          local_168 = uVar7;
          local_160 = (uchar *)string;
          local_154 = num_bytes;
          local_158 = XFastConvertUtf8ToUcs((uchar *)string,num_bytes,&ucs);
          if ((int)local_158 < 2) {
            local_158 = 1;
          }
          uVar3 = XUtf8IsNonSpacing(ucs);
          ucs_00 = ucs;
          if (uVar3 != 0) {
            ucs = (uint)uVar3;
            ucs_00 = (uint)uVar3;
          }
          for (; lVar9 != lVar10; lVar10 = lVar10 + 1) {
            if (ppXVar2[lVar10] != (XFontStruct *)0x0) {
              iVar4 = piVar1[lVar10];
              iVar5 = ucs2fontmap(glyph,ucs_00,iVar4);
              if ((-1 < iVar5) &&
                 ((iVar4 != 0 ||
                  ((local_140[lVar10 * 2] <= (int)ucs_00 &&
                   ((int)ucs_00 <= local_140[lVar10 * 2 + 1])))))) {
                if (iVar6 != (int)lVar10) goto LAB_001a7326;
                break;
              }
            }
          }
          lVar10 = local_150;
          ucs2fontmap(glyph,0x3f,piVar1[local_150]);
LAB_001a7326:
          iVar4 = local_154;
          if ((uVar3 == 0) && (local_16c == (int)lVar10)) {
            buf[(int)local_168].byte1 = glyph[0];
            buf[(int)local_168].byte2 = glyph[1];
            uVar7 = (ulong)((int)local_168 + 1);
          }
          else {
            iVar5 = XTextWidth16(ppXVar2[local_148],buf);
            local_178 = local_178 + iVar5;
            buf[0].byte1 = glyph[0];
            buf[0].byte2 = glyph[1];
            if (uVar3 != 0) {
              iVar5 = XTextWidth16(ppXVar2[(int)lVar10],buf,1);
              local_178 = local_178 - iVar5;
            }
            uVar7 = 1;
          }
          string = (char *)(local_160 + local_158);
          num_bytes = iVar4 - local_158;
          lVar8 = lVar10;
        } while( true );
      }
    }
  }
  return 0;
}

Assistant:

int
XUtf8TextWidth(XUtf8FontStruct 	*font_set,
	       const char 	*string,
	       int 		num_bytes) {

  int		x;
  int 		*encodings; /* encodings array */
  XFontStruct 	**fonts;    /* fonts array */
  Fl_XChar2b 	buf[128];   /* drawing buffer */
  int 		fnum;       /* index of the current font in the fonts array*/
  int 		i;          /* current byte in the XChar2b buffer */
  int 		first;      /* first valid font index */
  int 		last_fnum;  /* font index of the previous char */
  int 		nb_font;    /* quantity of fonts in the font array */
  char 		glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;    /* sub range of iso10646 */

  nb_font = font_set->nb_font;
  x = 0;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return x;
  }

  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  i = 0;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return x;
  }

  first = fnum;
  last_fnum = fnum;

  while (num_bytes > 0) {
    int 	 ulen;   /* byte length of the UTF-8 char */
    unsigned int ucs;    /* Unicode value of the UTF-8 char */
    unsigned int no_spc; /* Spacing char equivalent of a non-spacing char */

    if (i > 120) {
      /*** measure the buffer **/
      x += XTextWidth16(fonts[fnum], buf, i);
      i = 0;
    }

    ulen = XFastConvertUtf8ToUcs((const unsigned char*)string, num_bytes, &ucs);

    if (ulen < 1) ulen = 1;

    no_spc = XUtf8IsNonSpacing(ucs);
    if (no_spc) {
      ucs = no_spc;
    }

    /*
     * find the first encoding which can be used to
     * draw the glyph
     */
    fnum = first;
    while (fnum < nb_font) {
      if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
	if (encodings[fnum] != 0 ||
	    ((int)ucs >= ranges[fnum * 2] &&
	     (int)ucs <= ranges[fnum * 2 + 1])) {
	  break;
	}
      }
      fnum++;
    }
    if (fnum == nb_font) {
      /* the char is not valid in all encodings ->
       * draw it using the first font :-(
       */
      fnum = first;
      ucs2fontmap(glyph, '?', encodings[fnum]);
    }

    if (last_fnum != fnum || no_spc) {
      x += XTextWidth16(fonts[last_fnum], buf, i);
      i = 0;
      (*buf).byte1 = glyph[0];
      (*buf).byte2 = glyph[1];
      if (no_spc) {
	/* go back to draw the non-spacing char over the previous char */
	x -= XTextWidth16(fonts[fnum], buf, 1);
      }
    } else {
      (*(buf + i)).byte1 = glyph[0];
      (*(buf + i)).byte2 = glyph[1];
    }
    last_fnum = fnum;
    i++;
    string += ulen;
    num_bytes -= ulen;
  }

  x += XTextWidth16(fonts[last_fnum], buf, i);

  return x;
}